

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O0

vector<short,_std::allocator<short>_> * cppqc::shrinkIntegral<short>(short x)

{
  short sVar1;
  short in_SI;
  vector<short,_std::allocator<short>_> *in_RDI;
  short n;
  vector<short,_std::allocator<short>_> *ret;
  value_type_conflict4 *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  short local_20;
  
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)0x3ed638);
  local_20 = in_SI;
  if (in_SI < 0) {
    in_stack_ffffffffffffffc4 = (int)in_SI;
    sVar1 = std::numeric_limits<short>::min();
    if (in_stack_ffffffffffffffc4 == sVar1) {
      std::numeric_limits<short>::max();
      std::vector<short,_std::allocator<short>_>::push_back
                ((vector<short,_std::allocator<short>_> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
    }
    else {
      if (-(int)in_SI < 1) {
        __assert_fail("-x > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/include/cppqc/Arbitrary.h"
                      ,0x9c,
                      "std::vector<Integral> cppqc::shrinkIntegral(Integral) [Integral = short]");
      }
      std::vector<short,_std::allocator<short>_>::push_back
                ((vector<short,_std::allocator<short>_> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
    }
  }
  for (; local_20 != 0; local_20 = local_20 / 2) {
    std::vector<short,_std::allocator<short>_>::push_back
              ((vector<short,_std::allocator<short>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
  }
  return in_RDI;
}

Assistant:

std::vector<Integral> shrinkIntegral(Integral x) {
  std::vector<Integral> ret;
  if (std::numeric_limits<Integral>::is_signed && x < 0) {
    if (x == std::numeric_limits<Integral>::min()) {
      ret.push_back(std::numeric_limits<Integral>::max());
    } else {
      assert(-x > 0);
      ret.push_back(-x);
    }
  }

  for (Integral n = x; n != 0; n /= 2)
    ret.push_back(x - n);
  return ret;
}